

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_CreateFromStream
          (ktxStream *stream,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  
  if (newTex == (ktxTexture2 **)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    This = (ktxTexture2 *)malloc(0xa8);
    if (This == (ktxTexture2 *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = ktxTexture2_constructFromStream(This,stream,createFlags);
      if (kVar1 != KTX_SUCCESS) {
        free(This);
        This = (ktxTexture2 *)0x0;
      }
      *newTex = This;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromStream(ktxStream* stream,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture2** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromStream(tex, stream, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}